

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O3

void __thiscall CVmDbgFrameSymPtr::get_str_val(CVmDbgFrameSymPtr *this,vm_val_t *val)

{
  vm_obj_id_t vVar1;
  vm_datatype_t vVar2;
  vm_obj_id_t *pvVar3;
  
  pvVar3 = (vm_obj_id_t *)(this->p_ + G_dbg_lclsym_hdr_size_X);
  if ((this->p_[2] & 4) == 0) {
    vVar1 = CVmObjString::create(0,(char *)((long)pvVar3 + 2),(ulong)(ushort)*pvVar3);
    vVar2 = VM_OBJ;
  }
  else {
    vVar1 = *pvVar3;
    vVar2 = VM_SSTRING;
  }
  val->typ = vVar2;
  (val->val).obj = vVar1;
  return;
}

Assistant:

void CVmDbgFrameSymPtr::get_str_val(VMG_ vm_val_t *val) const
{
    /* get a pointer to the symbol field in this record */
    const char *symp = (const char *)p_ + G_dbg_lclsym_hdr_size;

    /* check whether the symbol string is in-line or in the constant pool */
    if (is_sym_inline())
    {
        /* it's inline, so we need to create a string object for it */
        val->set_obj(CVmObjString::create(vmg_ FALSE, symp + 2, osrp2(symp)));
    }
    else
    {
        /* it's in the constant pool, so we can just return a VM_SSTR */
        val->set_sstring(osrp4(symp));
    }
}